

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O3

void __thiscall
duckdb::BatchedBufferedData::Append(BatchedBufferedData *this,DataChunk *to_append,idx_t batch)

{
  mutex *__mutex;
  iterator *piVar1;
  _Base_ptr p_Var2;
  _Elt_pointer puVar3;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var4;
  int iVar5;
  DataChunk *this_00;
  pointer pDVar6;
  Allocator *allocator;
  type other;
  idx_t iVar7;
  mapped_type *this_01;
  InternalException *this_02;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_60;
  undefined1 local_58 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)batch;
  this_00 = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(this_00);
  local_60._M_head_impl = this_00;
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_60);
  allocator = Allocator::DefaultAllocator();
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_58,to_append);
  DataChunk::Initialize(pDVar6,allocator,(vector<duckdb::LogicalType,_true> *)local_58,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_58);
  other = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                     &local_60);
  DataChunk::Copy(to_append,other,0);
  pDVar6 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )&local_60);
  iVar7 = DataChunk::GetAllocationSize(pDVar6);
  __mutex = &(this->super_BufferedData).glock;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  if (this->min_batch == batch) {
    p_Var2 = (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((_Rb_tree_header *)p_Var2 != &(this->buffer)._M_t._M_impl.super__Rb_tree_header) &&
       (*(ulong *)(p_Var2 + 1) < batch)) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"Batches remaining in buffer","");
      InternalException::InternalException(this_02,(string *)local_58);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar3 = (this->read_queue).
             super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar3 == (this->read_queue).
                  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
      ::
      _M_push_back_aux<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
                ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                  *)&this->read_queue,
                 (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 &local_60);
    }
    else {
      (puVar3->super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = local_60._M_head_impl;
      local_60._M_head_impl = (DataChunk *)0x0;
      piVar1 = &(this->read_queue).
                super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    LOCK();
    (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i =
         (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i + iVar7;
    UNLOCK();
  }
  else {
    this_01 = ::std::
              map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
              ::operator[](&this->buffer,(key_type *)&local_38);
    this_01->completed = false;
    LOCK();
    (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i =
         (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i + iVar7;
    UNLOCK();
    puVar3 = (this_01->chunks).
             super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar3 == (this_01->chunks).
                  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
      ::
      _M_push_back_aux<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
                ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                  *)this_01,
                 (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 &local_60);
    }
    else {
      (puVar3->super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = local_60._M_head_impl;
      local_60._M_head_impl = (DataChunk *)0x0;
      piVar1 = &(this_01->chunks).
                super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Var4._M_head_impl = local_60._M_head_impl;
  if (local_60._M_head_impl != (DataChunk *)0x0) {
    DataChunk::~DataChunk(local_60._M_head_impl);
    operator_delete(_Var4._M_head_impl);
  }
  return;
}

Assistant:

void BatchedBufferedData::Append(const DataChunk &to_append, idx_t batch) {
	// We should never find any chunks with a smaller batch index than the minimum

	auto chunk = make_uniq<DataChunk>();
	chunk->Initialize(Allocator::DefaultAllocator(), to_append.GetTypes());
	to_append.Copy(*chunk, 0);
	auto allocation_size = chunk->GetAllocationSize();

	lock_guard<mutex> lock(glock);
	D_ASSERT(batch >= min_batch);
	auto is_minimum = IsMinimumBatchIndex(lock, batch);
	if (is_minimum) {
		for (auto &it : buffer) {
			auto batch_index = it.first;
			if (batch_index >= min_batch) {
				break;
			}
			// There should not be any batches in the buffer that are lower or equal to the minimum batch index
			throw InternalException("Batches remaining in buffer");
		}
		read_queue.push_back(std::move(chunk));
		read_queue_byte_count += allocation_size;
	} else {
		auto &in_progress_batch = buffer[batch];
		auto &chunks = in_progress_batch.chunks;
		in_progress_batch.completed = false;
		buffer_byte_count += allocation_size;
		chunks.push_back(std::move(chunk));
	}
}